

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_sdot_h_aarch64(void *vd,void *vn,void *vm,uint32_t desc)

{
  uintptr_t opr_sz_00;
  uintptr_t max_sz;
  int16_t *m;
  int16_t *n;
  uint64_t *d;
  intptr_t opr_sz;
  intptr_t i;
  uint32_t desc_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  opr_sz_00 = simd_oprsz(desc);
  for (opr_sz = 0; opr_sz < (long)opr_sz_00 / 8; opr_sz = opr_sz + 1) {
    *(long *)((long)vd + opr_sz * 8) =
         (long)*(short *)((long)vn + opr_sz * 8) * (long)*(short *)((long)vm + opr_sz * 8) +
         (long)*(short *)((long)vn + opr_sz * 8 + 2) * (long)*(short *)((long)vm + opr_sz * 8 + 2) +
         (long)*(short *)((long)vn + opr_sz * 8 + 4) * (long)*(short *)((long)vm + opr_sz * 8 + 4) +
         (long)*(short *)((long)vn + opr_sz * 8 + 6) * (long)*(short *)((long)vm + opr_sz * 8 + 6) +
         *(long *)((long)vd + opr_sz * 8);
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz_00,max_sz);
  return;
}

Assistant:

void HELPER(gvec_sdot_h)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc);
    uint64_t *d = vd;
    int16_t *n = vn, *m = vm;

    for (i = 0; i < opr_sz / 8; ++i) {
        d[i] += (int64_t)n[i * 4 + 0] * m[i * 4 + 0]
              + (int64_t)n[i * 4 + 1] * m[i * 4 + 1]
              + (int64_t)n[i * 4 + 2] * m[i * 4 + 2]
              + (int64_t)n[i * 4 + 3] * m[i * 4 + 3];
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}